

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_sort_helper(secp256k1_pubkey *pk,size_t *pk_order,size_t n_pk)

{
  int iVar1;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  secp256k1_pubkey *pk_test [5];
  size_t i;
  size_t in_stack_ffffffffffffffb8;
  secp256k1_pubkey **in_stack_ffffffffffffffc0;
  secp256k1_context *in_stack_ffffffffffffffc8;
  ulong local_20;
  
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    *(long *)(&stack0xffffffffffffffb8 + local_20 * 8) =
         in_RDI + *(long *)(in_RSI + local_20 * 8) * 0x40;
  }
  secp256k1_ec_pubkey_sort
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_20 = 0;
  while( true ) {
    if (in_RDX <= local_20) {
      return;
    }
    iVar1 = secp256k1_memcmp_var
                      (*(void **)(&stack0xffffffffffffffb8 + local_20 * 8),
                       (void *)(in_RDI + local_20 * 0x40),0x40);
    if (iVar1 != 0) break;
    local_20 = local_20 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c",
          0x19dd,
          "test condition failed: secp256k1_memcmp_var(pk_test[i], &pk[i], sizeof(*pk_test[i])) == 0"
         );
  abort();
}

Assistant:

static void test_sort_helper(secp256k1_pubkey *pk, size_t *pk_order, size_t n_pk) {
    size_t i;
    const secp256k1_pubkey *pk_test[5];

    for (i = 0; i < n_pk; i++) {
        pk_test[i] = &pk[pk_order[i]];
    }
    secp256k1_ec_pubkey_sort(CTX, pk_test, n_pk);
    for (i = 0; i < n_pk; i++) {
        CHECK(secp256k1_memcmp_var(pk_test[i], &pk[i], sizeof(*pk_test[i])) == 0);
    }
}